

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

nk_hash nk_murmur_hash(void *key,int len,nk_hash seed)

{
  uint uVar1;
  long lVar2;
  nk_uint h1;
  uint uVar3;
  nk_byte *data;
  byte *pbVar4;
  
  if (key == (void *)0x0) {
    return 0;
  }
  pbVar4 = (byte *)((long)key + (long)((len / 4) * 4));
  for (lVar2 = (long)-(len / 4); lVar2 != 0; lVar2 = lVar2 + 1) {
    uVar3 = ((uint)(*(int *)(pbVar4 + lVar2 * 4) * -0x3361d2af) >> 0x11 |
            *(int *)(pbVar4 + lVar2 * 4) * 0x16a88000) * 0x1b873593 ^ seed;
    seed = (uVar3 << 0xd | uVar3 >> 0x13) * 5 + 0xe6546b64;
  }
  uVar1 = 0;
  uVar3 = 0;
  switch(len & 3) {
  case 3:
    uVar3 = (uint)pbVar4[2] << 0x10;
  case 2:
    uVar1 = uVar3 | (uint)pbVar4[1] << 8;
  case 1:
    seed = seed ^ ((*pbVar4 ^ uVar1) * -0x3361d2af >> 0x11 | (*pbVar4 ^ uVar1) * 0x16a88000) *
                  0x1b873593;
  case 0:
    uVar3 = ((seed ^ len) >> 0x10 ^ seed ^ len) * -0x7a143595;
    uVar3 = (uVar3 >> 0xd ^ uVar3) * -0x3d4d51cb;
    return uVar3 >> 0x10 ^ uVar3;
  }
}

Assistant:

NK_API nk_hash
nk_murmur_hash(const void * key, int len, nk_hash seed)
{
    /* 32-Bit MurmurHash3: https://code.google.com/p/smhasher/wiki/MurmurHash3*/
    #define NK_ROTL(x,r) ((x) << (r) | ((x) >> (32 - r)))
    union {const nk_uint *i; const nk_byte *b;} conv = {0};
    const nk_byte *data = (const nk_byte*)key;
    const int nblocks = len/4;
    nk_uint h1 = seed;
    const nk_uint c1 = 0xcc9e2d51;
    const nk_uint c2 = 0x1b873593;
    const nk_byte *tail;
    const nk_uint *blocks;
    nk_uint k1;
    int i;

    /* body */
    if (!key) return 0;
    conv.b = (data + nblocks*4);
    blocks = (const nk_uint*)conv.i;
    for (i = -nblocks; i; ++i) {
        k1 = blocks[i];
        k1 *= c1;
        k1 = NK_ROTL(k1,15);
        k1 *= c2;

        h1 ^= k1;
        h1 = NK_ROTL(h1,13);
        h1 = h1*5+0xe6546b64;
    }

    /* tail */
    tail = (const nk_byte*)(data + nblocks*4);
    k1 = 0;
    switch (len & 3) {
    case 3: k1 ^= (nk_uint)(tail[2] << 16); /* fallthrough */
    case 2: k1 ^= (nk_uint)(tail[1] << 8u); /* fallthrough */
    case 1: k1 ^= tail[0];
            k1 *= c1;
            k1 = NK_ROTL(k1,15);
            k1 *= c2;
            h1 ^= k1;
            break;
    default: break;
    }

    /* finalization */
    h1 ^= (nk_uint)len;
    /* fmix32 */
    h1 ^= h1 >> 16;
    h1 *= 0x85ebca6b;
    h1 ^= h1 >> 13;
    h1 *= 0xc2b2ae35;
    h1 ^= h1 >> 16;

    #undef NK_ROTL
    return h1;
}